

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O0

void * __thiscall
Js::AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'\x10',_(unsigned_char)'\x01'>::Get
          (AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
           *this,AuxPointerType e)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  void **ppvVar4;
  uint8 i;
  AuxPointerType e_local;
  AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
  *this_local;
  
  if (this->count != '\x01') {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                ,0x5a,"(count == _MaxCount)","count == _MaxCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = false;
  while( true ) {
    if (bVar2) {
      return (void *)0x0;
    }
    if (this->type[0] == e) break;
    bVar2 = true;
  }
  ppvVar4 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)this->ptr);
  return *ppvVar4;
}

Assistant:

inline void* AuxPtrsFix<FieldsEnum, size, _MaxCount>::Get(FieldsEnum e)
    {
        Assert(count == _MaxCount);
        for (uint8 i = 0; i < _MaxCount; i++) // using _MaxCount instead of count so compiler can optimize in case _MaxCount is 1.
        {
            if ((FieldsEnum) type[i] == e)
            {
                return ptr[i];
            }
        }
        return nullptr;
    }